

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O3

void __thiscall Memory::HeapInfo::SweepPendingObjects(HeapInfo *this,RecyclerSweep *recyclerSweep)

{
  bool bVar1;
  long lVar2;
  
  bVar1 = RecyclerSweep::HasPendingSweepSmallHeapBlocks(recyclerSweep);
  if (bVar1) {
    lVar2 = 0x78;
    do {
      HeapBucketGroup<SmallAllocationBlockAttributes>::SweepPendingObjects
                ((HeapBucketGroup<SmallAllocationBlockAttributes> *)
                 ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->recycler +
                 lVar2),recyclerSweep);
      lVar2 = lVar2 + 0x380;
    } while (lVar2 != 0xa878);
    lVar2 = 0;
    do {
      HeapBucketGroup<MediumAllocationBlockAttributes>::SweepPendingObjects
                ((HeapBucketGroup<MediumAllocationBlockAttributes> *)
                 ((long)&this->mediumHeapBuckets[0].heapBucket.
                         super_SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                         .
                         super_HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                         .super_HeapBucket.heapInfo + lVar2),recyclerSweep);
      lVar2 = lVar2 + 0x380;
    } while (lVar2 != 0x6580);
  }
  LargeHeapBucket::SweepPendingObjects(&this->largeObjectBucket,recyclerSweep);
  return;
}

Assistant:

void
HeapInfo::SweepPendingObjects(RecyclerSweep& recyclerSweep)
{
    if (recyclerSweep.HasPendingSweepSmallHeapBlocks())
    {
        for (uint i = 0; i < HeapConstants::BucketCount; i++)
        {
            heapBuckets[i].SweepPendingObjects(recyclerSweep);
        }

#if defined(BUCKETIZE_MEDIUM_ALLOCATIONS) && SMALLBLOCK_MEDIUM_ALLOC
        for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
        {
            mediumHeapBuckets[i].SweepPendingObjects(recyclerSweep);
        }
#endif
    }

#if defined(BUCKETIZE_MEDIUM_ALLOCATIONS) && !SMALLBLOCK_MEDIUM_ALLOC
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        mediumHeapBuckets[i].SweepPendingObjects(recyclerSweep);
    }
#endif

    largeObjectBucket.SweepPendingObjects(recyclerSweep);
}